

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O2

void Handlers::StatSkill_Remove(Character *character,PacketReader *reader)

{
  bool bVar1;
  unsigned_short spell;
  PacketBuilder reply;
  
  PacketReader::GetInt(reader);
  spell = PacketReader::GetShort(reader);
  if (character->npc_type == Skills) {
    bVar1 = Character::DelSpell(character,spell);
    if (bVar1) {
      PacketBuilder::PacketBuilder(&reply,PACKET_STATSKILL,PACKET_REMOVE,2);
      PacketBuilder::AddShort(&reply,(int)(short)spell);
      Character::Send(character,&reply);
      PacketBuilder::~PacketBuilder(&reply);
    }
  }
  return;
}

Assistant:

void StatSkill_Remove(Character *character, PacketReader &reader)
{
	/*int shopid = */reader.GetInt();
	short spell_id = reader.GetShort();

	if (character->npc_type == ENF::Skills)
	{
		if (character->DelSpell(spell_id))
		{
			PacketBuilder reply(PACKET_STATSKILL, PACKET_REMOVE, 2);
			reply.AddShort(spell_id);
			character->Send(reply);
		}
	}
}